

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::createCompositeConstruct(Builder *this,Id typeId,Vector<Id> *constituents)

{
  uint *puVar1;
  pointer ppIVar2;
  iterator __position;
  Block *pBVar3;
  int iVar4;
  Id IVar5;
  Instruction *instruction;
  pointer puVar6;
  uint *puVar7;
  uint *puVar8;
  long lVar9;
  Instruction *raw_instruction;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  uint local_34;
  
  if ((2 < (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[typeId]->opCode - OpTypeArray) &&
     ((iVar4 = getNumTypeConstituents(this,typeId), iVar4 < 2 ||
      (iVar4 = getNumTypeConstituents(this,typeId),
      iVar4 != (int)((ulong)((long)(constituents->
                                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(constituents->
                                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 2))))) {
    __assert_fail("isAggregateType(typeId) || (getNumTypeConstituents(typeId) > 1 && getNumTypeConstituents(typeId) == (int)constituents.size())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0x7be,
                  "Id spv::Builder::createCompositeConstruct(Id, const dxil_spv::Vector<Id> &)");
  }
  if (this->generatingOpCodeForSpecConst != true) {
    instruction = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
    IVar5 = this->uniqueId + 1;
    this->uniqueId = IVar5;
    instruction->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
    instruction->resultId = IVar5;
    instruction->typeId = typeId;
    instruction->opCode = OpCompositeConstruct;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    instruction->block = (Block *)0x0;
    puVar6 = (constituents->
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(constituents->
                                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)puVar6) >> 2)) {
      lVar9 = 0;
      do {
        local_34 = puVar6[lVar9];
        __position._M_current =
             (instruction->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (instruction->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                     &instruction->operands,__position,&local_34);
        }
        else {
          *__position._M_current = local_34;
          (instruction->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        lVar9 = lVar9 + 1;
        puVar6 = (constituents->
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      } while (lVar9 < (int)((ulong)((long)(constituents->
                                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)puVar6) >> 2));
    }
    pBVar3 = this->buildPoint;
    local_40._M_head_impl = instruction;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&pBVar3->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
    instruction->block = pBVar3;
    if (instruction->resultId != 0) {
      Module::mapInstruction(pBVar3->parent->parent,instruction);
    }
    if (local_40._M_head_impl != (Instruction *)0x0) {
      (*(local_40._M_head_impl)->_vptr_Instruction[1])();
    }
    return instruction->resultId;
  }
  puVar7 = (constituents->
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (constituents->
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar9 = (long)puVar1 - (long)puVar7 >> 4;
  puVar8 = puVar7;
  if (0 < lVar9) {
    ppIVar2 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (uint *)(((long)puVar1 - (long)puVar7 & 0xfffffffffffffff0U) + (long)puVar7);
    lVar9 = lVar9 + 1;
    puVar7 = puVar7 + 2;
    do {
      if (ppIVar2[puVar7[-2]]->opCode - OpSpecConstantTrue < 5) {
        puVar7 = puVar7 + -2;
        goto LAB_001bc64b;
      }
      if (ppIVar2[puVar7[-1]]->opCode - OpSpecConstantTrue < 5) {
        puVar7 = puVar7 + -1;
        goto LAB_001bc64b;
      }
      if (ppIVar2[*puVar7]->opCode - OpSpecConstantTrue < 5) goto LAB_001bc64b;
      if (ppIVar2[puVar7[1]]->opCode - OpSpecConstantTrue < 5) {
        puVar7 = puVar7 + 1;
        goto LAB_001bc64b;
      }
      lVar9 = lVar9 + -1;
      puVar7 = puVar7 + 4;
    } while (1 < lVar9);
  }
  lVar9 = (long)puVar1 - (long)puVar8 >> 2;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      puVar7 = puVar1;
      if ((lVar9 != 3) ||
         (puVar7 = puVar8,
         (this->module).idToInstruction.
         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_start[*puVar8]->opCode - OpSpecConstantTrue < 5))
      goto LAB_001bc64b;
      puVar8 = puVar8 + 1;
    }
    puVar7 = puVar8;
    if ((this->module).idToInstruction.
        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
        _M_impl.super__Vector_impl_data._M_start[*puVar8]->opCode - OpSpecConstantTrue < 5)
    goto LAB_001bc64b;
    puVar8 = puVar8 + 1;
  }
  puVar7 = puVar8;
  if (4 < (this->module).idToInstruction.
          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start[*puVar8]->opCode - OpSpecConstantTrue) {
    puVar7 = puVar1;
  }
LAB_001bc64b:
  IVar5 = makeCompositeConstant(this,typeId,constituents,puVar7 != puVar1);
  return IVar5;
}

Assistant:

Id Builder::createCompositeConstruct(Id typeId, const dxil_spv::Vector<Id>& constituents)
{
    assert(isAggregateType(typeId) || (getNumTypeConstituents(typeId) > 1 && getNumTypeConstituents(typeId) == (int)constituents.size()));

    if (generatingOpCodeForSpecConst) {
        // Sometime, even in spec-constant-op mode, the constant composite to be
        // constructed may not be a specialization constant.
        // e.g.:
        //  const mat2 m2 = mat2(a_spec_const, a_front_end_const, another_front_end_const, third_front_end_const);
        // The first column vector should be a spec constant one, as a_spec_const is a spec constant.
        // The second column vector should NOT be spec constant, as it does not contain any spec constants.
        // To handle such cases, we check the constituents of the constant vector to determine whether this
        // vector should be created as a spec constant.
        return makeCompositeConstant(typeId, constituents,
                                     std::any_of(constituents.begin(), constituents.end(),
                                                 [&](spv::Id id) { return isSpecConstant(id); }));
    }

    Instruction* op = new Instruction(getUniqueId(), typeId, OpCompositeConstruct);
    for (int c = 0; c < (int)constituents.size(); ++c)
        op->addIdOperand(constituents[c]);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}